

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Legendre
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,int nderiv)

{
  double *pdVar1;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double col;
  double dVar2;
  double dVar3;
  REAL value;
  REAL ord_real;
  int ord;
  int ideriv;
  double in_stack_ffffffffffffff78;
  TPZFMatrix<double> *in_stack_ffffffffffffff80;
  double local_70;
  double local_68;
  int local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  long *local_20;
  long *local_18;
  int local_c;
  double local_8;
  
  if (0 < in_EDI) {
    local_30 = 0x3ff0000000000000;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    local_8 = in_XMM0_Qa;
    (**(code **)(*in_RSI + 0x100))(in_RSI,0,0,&local_30);
    local_38 = 0;
    (**(code **)(*local_20 + 0x100))(local_20,0,0,&local_38);
    for (local_3c = 1; local_3c < local_24; local_3c = local_3c + 1) {
      local_48 = 0;
      (**(code **)(*local_20 + 0x100))(local_20,(long)local_3c,0);
    }
    if (local_c != 1) {
      (**(code **)(*local_18 + 0x100))(local_18,1,0,&local_8);
      local_50 = 0x3ff0000000000000;
      (**(code **)(*local_20 + 0x100))(local_20,0,1,&local_50);
      for (local_3c = 1; local_3c < local_24; local_3c = local_3c + 1) {
        local_58 = 0;
        (**(code **)(*local_20 + 0x100))(local_20,(long)local_3c,1,&local_58);
      }
      for (local_5c = 2; local_5c < local_c; local_5c = local_5c + 1) {
        local_68 = (double)local_5c;
        col = ((local_68 - 1.0) + (local_68 - 1.0) + 1.0) * local_8;
        pdVar1 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                            (int64_t)col);
        in_stack_ffffffffffffff78 = *pdVar1;
        dVar2 = local_68 - 1.0;
        pdVar1 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                            (int64_t)col);
        local_70 = (col * in_stack_ffffffffffffff78 + -(dVar2 * *pdVar1)) / local_68;
        (**(code **)(*local_18 + 0x100))(local_18,(long)local_5c,0,&local_70);
        in_stack_ffffffffffffff80 =
             (TPZFMatrix<double> *)((local_68 - 1.0) + (local_68 - 1.0) + 1.0);
        pdVar1 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                            (int64_t)col);
        dVar2 = *pdVar1;
        pdVar1 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                            (int64_t)col);
        local_70 = (double)in_stack_ffffffffffffff80 * dVar2 + *pdVar1;
        (**(code **)(*local_20 + 0x100))(local_20,0,(long)local_5c,&local_70);
        for (local_3c = 1; local_3c < local_24; local_3c = local_3c + 1) {
          dVar3 = local_68 - 1.0;
          pdVar1 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                              (int64_t)col);
          dVar2 = *pdVar1;
          pdVar1 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                              (int64_t)col);
          local_70 = (dVar3 + dVar3 + 1.0) * dVar2 + *pdVar1;
          (**(code **)(*local_20 + 0x100))(local_20,(long)local_3c,(long)local_5c,&local_70);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Legendre(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, int nderiv){
		
		// Quadratic or higher shape functions
		if (num <= 0) return;
		phi.Put(0, 0, 1.0);
		dphi.Put(0, 0, 0.0);
		
		int ideriv;
		for (ideriv = 1; ideriv < nderiv; ideriv++)
			dphi.Put(ideriv, 0, 0.0);
		
		
		if (num == 1) return;
		
		phi.Put(1, 0, x);
		dphi.Put(0, 1, 1.0);
		
		for (ideriv = 1; ideriv < nderiv; ideriv++)
			dphi.Put(ideriv, 1, 0.0);
		
		int ord;
		//Aqui fica diferente do Chebyshev
		REAL ord_real, value;
		for (ord = 2; ord < num; ord++)
		{
			//casting int ord to REAL ord_real
			ord_real = (REAL)ord;
			//computing the ord_th function
			value    = ( (2.0 * (ord_real - 1.0) + 1.0) * x * phi(ord - 1, 0) - (ord_real - 1.0) * phi(ord - 2 , 0) ) / (ord_real);
			phi.Put(ord, 0, value);
			
			//computing the ord_th function's derivative
			value    = (2.0 * (ord_real - 1.0) + 1.0) * phi(ord - 1, 0) + dphi(0, ord - 2);
			dphi.Put(0, ord, value);
			
			for (ideriv = 1; ideriv < nderiv; ideriv++){
				value = (2.0 * (ord_real - 1.0) + 1.0) * dphi(ideriv - 1, ord - 1) + dphi(ideriv, ord - 2);
				dphi.Put(ideriv, ord, value);	    	 
			}
			
		}
		
#ifdef PZDEBUG
		int printing = 0;
		if (printing){
			cout << "Legendre" << endl;
			for(ord = 0; ord < num; ord++)
			{
				cout << "x = " << x << endl;
				cout << "phi(" << ord << ", 0) = " << phi(ord, 0) << endl;
				cout << "dphi(0, " << ord << " = " << dphi(0, ord) << endl;
				cout << endl;
			}
		}
#endif
		
	}